

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBlock.cpp
# Opt level: O2

bool Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::RescanObject
               (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *block,char *objectAddress,
               uint localObjectSize,uint objectIndex,Recycler *recycler)

{
  size_t sVar1;
  bool bVar2;
  undefined1 in_XMM1 [16];
  undefined1 auVar3 [16];
  
  bVar2 = Recycler::AddMark(recycler,objectAddress,(ulong)localObjectSize);
  if (bVar2) {
    sVar1 = (recycler->collectionStats).markData.rescanObjectByteCount;
    auVar3 = pmovsxbq(in_XMM1,0x101);
    (recycler->collectionStats).markData.rescanObjectCount =
         auVar3._0_8_ + (recycler->collectionStats).markData.rescanObjectCount;
    (recycler->collectionStats).markData.rescanObjectByteCount = localObjectSize + sVar1;
  }
  return bVar2;
}

Assistant:

bool
SmallNormalHeapBlockT<TBlockAttributes>::RescanObject(SmallNormalHeapBlockT<TBlockAttributes>* block,
    __in_ecount(localObjectSize) char * objectAddress, uint localObjectSize,
    uint objectIndex, Recycler * recycler)
{
    // REVIEW: This would be a good assert to have but we don't have the heap block here
    // Assert(block->GetAddressIndex(objectAddress) != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit);

    if (!recycler->AddMark(objectAddress, localObjectSize))
    {
        // Failed to add to the mark stack due to OOM.
        return false;
    }

    RECYCLER_STATS_INC(recycler, markData.rescanObjectCount);
    RECYCLER_STATS_ADD(recycler, markData.rescanObjectByteCount, localObjectSize);

    return true;
}